

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

RegSlot __thiscall
ByteCodeGenerator::PrependLocalScopes
          (ByteCodeGenerator *this,RegSlot evalEnv,RegSlot tempLoc,FuncInfo *funcInfo)

{
  Scope *pSVar1;
  bool bVar2;
  RegSlot RVar3;
  uint uVar4;
  Scope *pSVar5;
  Scope *local_58;
  Scope *local_48;
  Scope *innerScope;
  Scope *pSStack_38;
  bool acquireTempLoc;
  Scope *funcScope;
  Scope *currScope;
  FuncInfo *funcInfo_local;
  RegSlot tempLoc_local;
  RegSlot evalEnv_local;
  ByteCodeGenerator *this_local;
  
  pSVar1 = this->currentScope;
  pSVar5 = FuncInfo::GetCurrentChildScope(funcInfo);
  if (pSVar5 == (Scope *)0x0) {
    local_58 = FuncInfo::GetBodyScope(funcInfo);
  }
  else {
    local_58 = FuncInfo::GetCurrentChildScope(funcInfo);
  }
  pSStack_38 = local_58;
  this_local._4_4_ = evalEnv;
  if (pSVar1 != local_58) {
    funcInfo_local._4_4_ = evalEnv;
    funcInfo_local._0_4_ = tempLoc;
    if (tempLoc == 0xffffffff) {
      funcInfo_local._0_4_ = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    while (local_48 = pSVar1, pSVar1 != pSStack_38) {
      while (pSVar5 = Scope::GetEnclosingScope(local_48), pSVar5 != pSStack_38) {
        local_48 = Scope::GetEnclosingScope(local_48);
      }
      bVar2 = Scope::GetMustInstantiate(local_48);
      if (bVar2) {
        bVar2 = Scope::HasInnerScopeIndex(local_48);
        if (bVar2) {
          RVar3 = FuncInfo::GetEnvRegister(funcInfo);
          if ((funcInfo_local._4_4_ == RVar3) ||
             (funcInfo_local._4_4_ == funcInfo->frameDisplayRegister)) {
            uVar4 = Scope::GetInnerScopeIndex(local_48);
            Js::ByteCodeWriter::Reg1Unsigned1
                      (&this->m_writer,LdIndexedFrameDisplayNoParent,(RegSlot)funcInfo_local,uVar4);
          }
          else {
            uVar4 = Scope::GetInnerScopeIndex(local_48);
            Js::ByteCodeWriter::Reg2Int1
                      (&this->m_writer,LdIndexedFrameDisplay,(RegSlot)funcInfo_local,
                       funcInfo_local._4_4_,uVar4);
          }
        }
        else {
          RVar3 = FuncInfo::GetEnvRegister(funcInfo);
          if ((funcInfo_local._4_4_ == RVar3) ||
             (funcInfo_local._4_4_ == funcInfo->frameDisplayRegister)) {
            RVar3 = Scope::GetLocation(local_48);
            Js::ByteCodeWriter::Reg2
                      (&this->m_writer,LdInnerFrameDisplayNoParent,(RegSlot)funcInfo_local,RVar3);
          }
          else {
            RVar3 = Scope::GetLocation(local_48);
            Js::ByteCodeWriter::Reg3
                      (&this->m_writer,LdInnerFrameDisplay,(RegSlot)funcInfo_local,RVar3,
                       funcInfo_local._4_4_);
          }
        }
        funcInfo_local._4_4_ = (RegSlot)funcInfo_local;
      }
      pSStack_38 = local_48;
    }
    if (tempLoc == 0xffffffff) {
      FuncInfo::ReleaseTmpRegister(funcInfo,(RegSlot)funcInfo_local);
    }
    this_local._4_4_ = funcInfo_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

Js::RegSlot ByteCodeGenerator::PrependLocalScopes(Js::RegSlot evalEnv, Js::RegSlot tempLoc, FuncInfo *funcInfo)
{
    Scope *currScope = this->currentScope;
    Scope *funcScope = funcInfo->GetCurrentChildScope() ? funcInfo->GetCurrentChildScope() : funcInfo->GetBodyScope();

    if (currScope == funcScope)
    {
        return evalEnv;
    }

    bool acquireTempLoc = tempLoc == Js::Constants::NoRegister;
    if (acquireTempLoc)
    {
        tempLoc = funcInfo->AcquireTmpRegister();
    }

    // The with/catch objects must be prepended to the environment we pass to eval() or to a func declared inside with,
    // but the list must first be reversed so that innermost scopes appear first in the list.
    while (currScope != funcScope)
    {
        Scope *innerScope;
        for (innerScope = currScope; innerScope->GetEnclosingScope() != funcScope; innerScope = innerScope->GetEnclosingScope())
            ;
        if (innerScope->GetMustInstantiate())
        {
            if (!innerScope->HasInnerScopeIndex())
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg2(Js::OpCode::LdInnerFrameDisplayNoParent, tempLoc, innerScope->GetLocation());
                }
                else
                {
                    this->m_writer.Reg3(Js::OpCode::LdInnerFrameDisplay, tempLoc, innerScope->GetLocation(), evalEnv);
                }
            }
            else
            {
                if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
                {
                    this->m_writer.Reg1Unsigned1(Js::OpCode::LdIndexedFrameDisplayNoParent, tempLoc, innerScope->GetInnerScopeIndex());
                }
                else
                {
                    this->m_writer.Reg2Int1(Js::OpCode::LdIndexedFrameDisplay, tempLoc, evalEnv, innerScope->GetInnerScopeIndex());
                }
            }
            evalEnv = tempLoc;
        }
        funcScope = innerScope;
    }

    if (acquireTempLoc)
    {
        funcInfo->ReleaseTmpRegister(tempLoc);
    }
    return evalEnv;
}